

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Homogeneous.h
# Opt level: O0

void __thiscall
Eigen::internal::
homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
          (homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
           *this,Matrix<float,_4,_1,_0,_4,_1> *dst)

{
  Matrix<float,_4,_4,_0,_4,_4> *xpr;
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *this_00;
  Index IVar1;
  Index IVar2;
  ConstColXpr local_118;
  ConstRowwiseReturnType local_e8;
  Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
  local_b8;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false> local_80;
  Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
  local_50;
  Matrix<float,4,1,0,4,1> *local_18;
  Matrix<float,_4,_1,_0,_4,_1> *dst_local;
  homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
  *this_local;
  
  xpr = *(Matrix<float,_4,_4,_0,_4,_4> **)this;
  local_18 = (Matrix<float,4,1,0,4,1> *)dst;
  dst_local = (Matrix<float,_4,_1,_0,_4,_1> *)this;
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::rows
                    (*(PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> **)this);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::cols
                    (*(PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> **)this);
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>::Block
            (&local_80,xpr,0,0,IVar1,IVar2 + -1);
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>>::operator*
            (&local_50,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>> *)&local_80,
             *(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> **)(this + 8));
  Matrix<float,4,1,0,4,1>::operator=
            (local_18,(DenseBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_>
                       *)&local_50);
  this_00 = *(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> **)this;
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::cols
                    (*(PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> **)this);
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::col(&local_118,this_00,IVar1 + -1);
  DenseBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::rowwise
            (&local_e8,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
             &local_118);
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::cols
                    (*(PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> **)(this + 8));
  VectorwiseOp<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>::
  replicate<1>(&local_b8,&local_e8,IVar1);
  MatrixBase<Eigen::Matrix<float,4,1,0,4,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,4,1,0,4,1>> *)local_18,
             (MatrixBase<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
              *)&local_b8);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void evalTo(Dest& dst) const
  {
    // FIXME investigate how to allow lazy evaluation of this product when possible
    dst = Block<const LhsMatrixTypeNested,
              LhsMatrixTypeNested::RowsAtCompileTime,
              LhsMatrixTypeNested::ColsAtCompileTime==Dynamic?Dynamic:LhsMatrixTypeNested::ColsAtCompileTime-1>
            (m_lhs,0,0,m_lhs.rows(),m_lhs.cols()-1) * m_rhs;
    dst += m_lhs.col(m_lhs.cols()-1).rowwise()
            .template replicate<MatrixType::ColsAtCompileTime>(m_rhs.cols());
  }